

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

Value * __thiscall
cmake::ReportCapabilitiesJson(Value *__return_storage_ptr__,cmake *this,bool haveServerMode)

{
  __node_base_ptr *this_00;
  bool bVar1;
  Value *pVVar2;
  pointer pGVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  pointer pvVar6;
  Value local_388;
  Value local_360;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_true>
  local_338;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_true>
  local_330;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_true>
  local_328;
  const_iterator i_1;
  Value generators;
  Value *gen_1;
  Value local_2a0;
  Value local_278;
  Value local_250;
  Value local_228;
  undefined1 local_200 [8];
  Value gen;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_1d0;
  __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_1c8;
  const_iterator i;
  JsonValueMapType generatorMap;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generatorInfoList;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  undefined1 local_48 [8];
  Value version;
  bool haveServerMode_local;
  cmake *this_local;
  Value *obj;
  
  version.limit_._6_1_ = 0;
  version.limit_._7_1_ = haveServerMode;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value((Value *)local_48,objectValue);
  Json::Value::Value(&local_80,"3.9.20170807-gcd520");
  pVVar2 = Json::Value::operator[]((Value *)local_48,"string");
  Json::Value::operator=(pVVar2,&local_80);
  Json::Value::~Value(&local_80);
  Json::Value::Value(&local_a8,3);
  pVVar2 = Json::Value::operator[]((Value *)local_48,"major");
  Json::Value::operator=(pVVar2,&local_a8);
  Json::Value::~Value(&local_a8);
  Json::Value::Value(&local_d0,9);
  pVVar2 = Json::Value::operator[]((Value *)local_48,"minor");
  Json::Value::operator=(pVVar2,&local_d0);
  Json::Value::~Value(&local_d0);
  Json::Value::Value(&local_f8,"gcd520");
  pVVar2 = Json::Value::operator[]((Value *)local_48,"suffix");
  Json::Value::operator=(pVVar2,&local_f8);
  Json::Value::~Value(&local_f8);
  Json::Value::Value(&local_120,false);
  pVVar2 = Json::Value::operator[]((Value *)local_48,"isDirty");
  Json::Value::operator=(pVVar2,&local_120);
  Json::Value::~Value(&local_120);
  Json::Value::Value(&local_148,0x133c837);
  pVVar2 = Json::Value::operator[]((Value *)local_48,"patch");
  Json::Value::operator=(pVVar2,&local_148);
  Json::Value::~Value(&local_148);
  Json::Value::Value((Value *)&generatorInfoList.
                               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(Value *)local_48)
  ;
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=
            (pVVar2,(Value *)&generatorInfoList.
                              super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::~Value((Value *)&generatorInfoList.
                                super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = &generatorMap._M_h._M_single_bucket;
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::vector
            ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)this_00);
  GetRegisteredGenerators
            (this,(vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)this_00);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                   *)&i);
  local_1d0._M_current =
       (GeneratorInfo *)
       std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::begin
                 ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                  &generatorMap._M_h._M_single_bucket);
  __gnu_cxx::
  __normal_iterator<cmake::GeneratorInfo_const*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>
  ::__normal_iterator<cmake::GeneratorInfo*>
            ((__normal_iterator<cmake::GeneratorInfo_const*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>
              *)&local_1c8,&local_1d0);
  while( true ) {
    gen.limit_ = (size_t)std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
                         end((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                             &generatorMap._M_h._M_single_bucket);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1c8,
                       (__normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                        *)&gen.limit_);
    if (!bVar1) break;
    pGVar3 = __gnu_cxx::
             __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
             ::operator->(&local_1c8);
    if ((pGVar3->isAlias & 1U) == 0) {
      __gnu_cxx::
      __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
      ::operator->(&local_1c8);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        pGVar3 = __gnu_cxx::
                 __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                 ::operator->(&local_1c8);
        pmVar5 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                               *)&i,&pGVar3->baseName);
        pVVar2 = Json::Value::operator[](pmVar5,"extraGenerators");
        pGVar3 = __gnu_cxx::
                 __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                 ::operator->(&local_1c8);
        Json::Value::Value((Value *)&generators.limit_,&pGVar3->extraName);
        Json::Value::append(pVVar2,(Value *)&generators.limit_);
        Json::Value::~Value((Value *)&generators.limit_);
      }
      else {
        Json::Value::Value((Value *)local_200,objectValue);
        pGVar3 = __gnu_cxx::
                 __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                 ::operator->(&local_1c8);
        Json::Value::Value(&local_228,&pGVar3->name);
        pVVar2 = Json::Value::operator[]((Value *)local_200,"name");
        Json::Value::operator=(pVVar2,&local_228);
        Json::Value::~Value(&local_228);
        pGVar3 = __gnu_cxx::
                 __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                 ::operator->(&local_1c8);
        Json::Value::Value(&local_250,(bool)(pGVar3->supportsToolset & 1));
        pVVar2 = Json::Value::operator[]((Value *)local_200,"toolsetSupport");
        Json::Value::operator=(pVVar2,&local_250);
        Json::Value::~Value(&local_250);
        pGVar3 = __gnu_cxx::
                 __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                 ::operator->(&local_1c8);
        Json::Value::Value(&local_278,(bool)(pGVar3->supportsPlatform & 1));
        pVVar2 = Json::Value::operator[]((Value *)local_200,"platformSupport");
        Json::Value::operator=(pVVar2,&local_278);
        Json::Value::~Value(&local_278);
        Json::Value::Value(&local_2a0,arrayValue);
        pVVar2 = Json::Value::operator[]((Value *)local_200,"extraGenerators");
        Json::Value::operator=(pVVar2,&local_2a0);
        Json::Value::~Value(&local_2a0);
        Json::Value::Value((Value *)&gen_1,(Value *)local_200);
        pGVar3 = __gnu_cxx::
                 __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                 ::operator->(&local_1c8);
        pmVar5 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                               *)&i,&pGVar3->name);
        Json::Value::operator=(pmVar5,(Value *)&gen_1);
        Json::Value::~Value((Value *)&gen_1);
        Json::Value::~Value((Value *)local_200);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
    ::operator++(&local_1c8);
  }
  Json::Value::Value((Value *)&i_1,arrayValue);
  local_330._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                *)&i);
  std::__detail::
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_false,_true>
              *)&local_328,
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_false,_true>
              *)&local_330);
  while( true ) {
    local_338._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                *)&i);
    bVar1 = std::__detail::operator!=(&local_328,&local_338);
    if (!bVar1) break;
    pvVar6 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_false,_true>
                           *)&local_328);
    Json::Value::append((Value *)&i_1,&pvVar6->second);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_false,_true>
                  *)&local_328);
  }
  Json::Value::Value(&local_360,(Value *)&i_1);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"generators");
  Json::Value::operator=(pVVar2,&local_360);
  Json::Value::~Value(&local_360);
  Json::Value::Value(&local_388,(bool)(version.limit_._7_1_ & 1));
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"serverMode");
  Json::Value::operator=(pVVar2,&local_388);
  Json::Value::~Value(&local_388);
  version.limit_._6_1_ = 1;
  Json::Value::~Value((Value *)&i_1);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                    *)&i);
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
            ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
             &generatorMap._M_h._M_single_bucket);
  Json::Value::~Value((Value *)local_48);
  if ((version.limit_._6_1_ & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportCapabilitiesJson(bool haveServerMode) const
{
  Json::Value obj = Json::objectValue;
  // Version information:
  Json::Value version = Json::objectValue;
  version["string"] = CMake_VERSION;
  version["major"] = CMake_VERSION_MAJOR;
  version["minor"] = CMake_VERSION_MINOR;
  version["suffix"] = CMake_VERSION_SUFFIX;
  version["isDirty"] = (CMake_VERSION_IS_DIRTY == 1);
  version["patch"] = CMake_VERSION_PATCH;

  obj["version"] = version;

  // Generators:
  std::vector<cmake::GeneratorInfo> generatorInfoList;
  this->GetRegisteredGenerators(generatorInfoList);

  JsonValueMapType generatorMap;
  for (std::vector<cmake::GeneratorInfo>::const_iterator i =
         generatorInfoList.begin();
       i != generatorInfoList.end(); ++i) {
    if (i->isAlias) { // skip aliases, they are there for compatibility reasons
                      // only
      continue;
    }

    if (i->extraName.empty()) {
      Json::Value gen = Json::objectValue;
      gen["name"] = i->name;
      gen["toolsetSupport"] = i->supportsToolset;
      gen["platformSupport"] = i->supportsPlatform;
      gen["extraGenerators"] = Json::arrayValue;
      generatorMap[i->name] = gen;
    } else {
      Json::Value& gen = generatorMap[i->baseName];
      gen["extraGenerators"].append(i->extraName);
    }
  }

  Json::Value generators = Json::arrayValue;
  for (JsonValueMapType::const_iterator i = generatorMap.begin();
       i != generatorMap.end(); ++i) {
    generators.append(i->second);
  }
  obj["generators"] = generators;
  obj["serverMode"] = haveServerMode;

  return obj;
}